

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_ssi_filter_module.c
# Opt level: O2

ngx_int_t ngx_http_ssi_evaluate_string
                    (ngx_http_request_t *r,ngx_http_ssi_ctx_t *ctx,ngx_str_t *text,ngx_uint_t flags)

{
  ngx_buf_t *pnVar1;
  u_char uVar2;
  byte bVar3;
  bool bVar4;
  undefined1 auVar5 [8];
  ngx_pool_t *pnVar6;
  ngx_uint_t nVar7;
  ngx_str_t *pnVar8;
  ngx_http_variable_value_t *pnVar9;
  ngx_buf_t *pnVar10;
  size_t *psVar11;
  undefined8 *puVar12;
  u_char *puVar13;
  ngx_buf_t *pnVar14;
  char *fmt;
  void *pvVar15;
  ngx_buf_t *pnVar16;
  ngx_log_t *log;
  ngx_buf_t *pnVar17;
  byte *pbVar18;
  byte *pbVar19;
  size_t sVar20;
  long lVar21;
  undefined1 local_b0 [8];
  ngx_array_t lengths;
  ngx_array_t values;
  uint local_50;
  size_t local_48;
  ngx_int_t local_40;
  ngx_buf_t *local_38;
  
  nVar7 = ngx_http_script_variables_count((ngx_str_t *)ctx);
  if (nVar7 == 0) {
    pbVar18 = ctx->pos;
    pbVar19 = pbVar18;
    if ((((ulong)text & 1) != 0) && (*pbVar18 != 0x2f)) {
      sVar20 = (r->uri).len;
      for (lVar21 = -sVar20; lVar21 != 0; lVar21 = lVar21 + 1) {
        if ((r->uri).data[sVar20 - 1] == '/') {
          pbVar19 = (byte *)ngx_pnalloc(r->pool,(long)ctx->buf - lVar21);
          if (pbVar19 == (byte *)0x0) {
            return -1;
          }
          memcpy(pbVar19,(r->uri).data,-lVar21);
          pbVar18 = pbVar19 + -lVar21;
          break;
        }
        sVar20 = sVar20 - 1;
      }
    }
    pnVar14 = (ngx_buf_t *)0x0;
    bVar4 = false;
    do {
      if (ctx->buf <= pnVar14) {
        ctx->buf = (ngx_buf_t *)(pbVar18 + -(long)pbVar19);
        ctx->pos = pbVar19;
        return 0;
      }
      bVar3 = ctx->pos[(long)pnVar14];
      if (bVar4) {
        if ((0x3a < bVar3 - 0x22) ||
           ((0x400000000000025U >> ((ulong)(bVar3 - 0x22) & 0x3f) & 1) == 0)) {
          *pbVar18 = 0x5c;
          pbVar18 = pbVar18 + 1;
        }
LAB_0015a16f:
        *pbVar18 = bVar3;
        pbVar18 = pbVar18 + 1;
        bVar4 = false;
      }
      else {
        bVar4 = true;
        if (bVar3 != 0x5c) goto LAB_0015a16f;
      }
      pnVar14 = (ngx_buf_t *)((long)&pnVar14->pos + 1);
    } while( true );
  }
  lengths.nalloc = (ngx_uint_t)r->pool;
  lengths.elts = (void *)0x0;
  lengths.nelts = 8;
  lengths.size = 8;
  local_b0 = (undefined1  [8])ngx_palloc((ngx_pool_t *)lengths.nalloc,0x40);
  local_40 = -1;
  if (local_b0 == (undefined1  [8])0x0) {
    return -1;
  }
  values.nalloc = (ngx_uint_t)r->pool;
  values.elts = (void *)0x0;
  values.nelts = 8;
  values.size = 8;
  lengths.pool = (ngx_pool_t *)ngx_palloc((ngx_pool_t *)values.nalloc,0x40);
  if (lengths.pool == (ngx_pool_t *)0x0) {
    return -1;
  }
  local_38 = (ngx_buf_t *)0x0;
  pnVar14 = (ngx_buf_t *)0x0;
  while (pnVar6 = lengths.pool, auVar5 = local_b0, pnVar10 = ctx->buf, pnVar14 < pnVar10) {
    puVar13 = ctx->pos;
    if (puVar13[(long)pnVar14] != '$') {
      pbVar18 = puVar13 + (long)pnVar14;
      bVar4 = false;
      pbVar19 = pbVar18;
      for (; pnVar14 < pnVar10; pnVar14 = (ngx_buf_t *)((long)&pnVar14->pos + 1)) {
        bVar3 = ctx->pos[(long)pnVar14];
        if (bVar4) {
          if ((0x3a < bVar3 - 0x22) ||
             ((0x400000000000025U >> ((ulong)(bVar3 - 0x22) & 0x3f) & 1) == 0)) {
            *pbVar19 = 0x5c;
            pbVar19 = pbVar19 + 1;
          }
LAB_00159f81:
          *pbVar19 = bVar3;
          pbVar19 = pbVar19 + 1;
          pnVar10 = ctx->buf;
          bVar4 = false;
        }
        else {
          if (bVar3 != 0x5c) {
            if (bVar3 != 0x24) goto LAB_00159f81;
            break;
          }
          bVar4 = true;
        }
      }
      sVar20 = (long)pbVar19 - (long)pbVar18;
      goto LAB_00159fa2;
    }
    values.pool = (ngx_pool_t *)0x0;
    pnVar16 = (ngx_buf_t *)((long)&pnVar14->pos + 1);
    if ((pnVar16 == pnVar10) ||
       ((uVar2 = puVar13[(long)pnVar16], uVar2 == '{' &&
        (pnVar16 = (ngx_buf_t *)((long)&pnVar14->pos + 2), pnVar16 == pnVar10)))) {
LAB_00159ff1:
      log = r->connection->log;
      if (log->log_level < 4) {
        return 1;
      }
      fmt = "invalid variable name in \"%V\"";
LAB_0015a019:
      ngx_log_error_core(4,log,0,fmt,ctx);
      return 1;
    }
    pnVar17 = pnVar10;
    if (pnVar10 < pnVar16) {
      pnVar17 = pnVar16;
    }
    for (; pnVar1 = (ngx_buf_t *)((long)&pnVar16->pos + (long)&((values.pool)->d).last),
        pnVar14 = pnVar17, pnVar1 < pnVar10;
        values.pool = (ngx_pool_t *)((long)&((values.pool)->d).last + 1)) {
      bVar3 = (puVar13 + (long)pnVar16)[(long)values.pool];
      if ((uVar2 == '{') && (bVar3 == 0x7d)) {
        pnVar14 = (ngx_buf_t *)
                  ((undefined1 *)((long)&pnVar16->pos + 1) + (long)&((values.pool)->d).last);
        goto LAB_00159edc;
      }
      if ((0x19 < (byte)((bVar3 & 0xdf) + 0xbf)) &&
         (pnVar14 = pnVar1, bVar3 != 0x5f && 9 < (byte)(bVar3 - 0x30))) break;
    }
    if (uVar2 == '{') {
      log = r->connection->log;
      if (log->log_level < 4) {
        return 1;
      }
      fmt = "the closing bracket in \"%V\" variable is missing";
      ctx = (ngx_http_ssi_ctx_t *)&values.pool;
      goto LAB_0015a019;
    }
LAB_00159edc:
    if (values.pool == (ngx_pool_t *)0x0) goto LAB_00159ff1;
    nVar7 = ngx_hash_strlow(puVar13 + (long)pnVar16,puVar13 + (long)pnVar16,(size_t)values.pool);
    pnVar8 = ngx_http_ssi_get_variable(r,(ngx_str_t *)&values.pool,nVar7);
    if (pnVar8 != (ngx_str_t *)0x0) {
      sVar20 = pnVar8->len;
      pbVar18 = pnVar8->data;
      goto LAB_00159fa2;
    }
    pnVar9 = ngx_http_get_variable(r,(ngx_str_t *)&values.pool,nVar7);
    if (pnVar9 == (ngx_http_variable_value_t *)0x0) {
      return -1;
    }
    if ((*(uint *)pnVar9 >> 0x1e & 1) == 0) {
      pbVar18 = pnVar9->data;
      sVar20 = (size_t)(*(uint *)pnVar9 & 0xfffffff);
LAB_00159fa2:
      psVar11 = (size_t *)ngx_array_push((ngx_array_t *)local_b0);
      if (psVar11 == (size_t *)0x0) {
        return -1;
      }
      *psVar11 = sVar20;
      puVar12 = (undefined8 *)ngx_array_push((ngx_array_t *)&lengths.pool);
      if (puVar12 == (undefined8 *)0x0) {
        return -1;
      }
      local_38 = (ngx_buf_t *)((long)&local_38->pos + sVar20);
      *puVar12 = pbVar18;
    }
  }
  if (((ulong)text & 1) != 0) {
    for (pvVar15 = (void *)0x0; values.elts != pvVar15; pvVar15 = (void *)((long)pvVar15 + 1)) {
      if (*(long *)((long)local_b0 + (long)pvVar15 * 8) != 0) {
        if (*(&((lengths.pool)->d).last)[(long)pvVar15] != '/') {
          sVar20 = (r->uri).len;
          goto LAB_0015a1fe;
        }
        break;
      }
    }
  }
LAB_0015a06e:
  local_48 = 0;
  goto LAB_0015a07a;
  while (sVar20 = local_48 - 1, ((r->uri).data + -1)[local_48] != '/') {
LAB_0015a1fe:
    local_48 = sVar20;
    if (local_48 == 0) goto LAB_0015a06e;
  }
  local_38 = (ngx_buf_t *)((long)&local_38->pos + local_48);
LAB_0015a07a:
  local_50 = (uint)text;
  puVar13 = (u_char *)ngx_pnalloc(r->pool,(long)&local_38->pos + (ulong)((local_50 >> 1 & 1) != 0));
  if (puVar13 != (u_char *)0x0) {
    ctx->buf = local_38;
    ctx->pos = puVar13;
    memcpy(puVar13,(r->uri).data,local_48);
    puVar13 = puVar13 + local_48;
    local_40 = 0;
    for (pvVar15 = (void *)0x0; pvVar15 < values.elts; pvVar15 = (void *)((long)pvVar15 + 1)) {
      memcpy(puVar13,(&(pnVar6->d).last)[(long)pvVar15],
             *(size_t *)((long)auVar5 + (long)pvVar15 * 8));
      puVar13 = puVar13 + *(long *)((long)auVar5 + (long)pvVar15 * 8);
    }
  }
  return local_40;
}

Assistant:

static ngx_int_t
ngx_http_ssi_evaluate_string(ngx_http_request_t *r, ngx_http_ssi_ctx_t *ctx,
    ngx_str_t *text, ngx_uint_t flags)
{
    u_char                      ch, *p, **value, *data, *part_data;
    size_t                     *size, len, prefix, part_len;
    ngx_str_t                   var, *val;
    ngx_int_t                   key;
    ngx_uint_t                  i, n, bracket, quoted;
    ngx_array_t                 lengths, values;
    ngx_http_variable_value_t  *vv;

    n = ngx_http_script_variables_count(text);

    if (n == 0) {

        data = text->data;
        p = data;

        if ((flags & NGX_HTTP_SSI_ADD_PREFIX) && text->data[0] != '/') {

            for (prefix = r->uri.len; prefix; prefix--) {
                if (r->uri.data[prefix - 1] == '/') {
                    break;
                }
            }

            if (prefix) {
                len = prefix + text->len;

                data = ngx_pnalloc(r->pool, len);
                if (data == NULL) {
                    return NGX_ERROR;
                }

                p = ngx_copy(data, r->uri.data, prefix);
            }
        }

        quoted = 0;

        for (i = 0; i < text->len; i++) {
            ch = text->data[i];

            if (!quoted) {

                if (ch == '\\') {
                    quoted = 1;
                    continue;
                }

            } else {
                quoted = 0;

                if (ch != '\\' && ch != '\'' && ch != '"' && ch != '$') {
                    *p++ = '\\';
                }
            }

            *p++ = ch;
        }

        text->len = p - data;
        text->data = data;

        return NGX_OK;
    }

    if (ngx_array_init(&lengths, r->pool, 8, sizeof(size_t *)) != NGX_OK) {
        return NGX_ERROR;
    }

    if (ngx_array_init(&values, r->pool, 8, sizeof(u_char *)) != NGX_OK) {
        return NGX_ERROR;
    }

    len = 0;
    i = 0;

    while (i < text->len) {

        if (text->data[i] == '$') {

            var.len = 0;

            if (++i == text->len) {
                goto invalid_variable;
            }

            if (text->data[i] == '{') {
                bracket = 1;

                if (++i == text->len) {
                    goto invalid_variable;
                }

                var.data = &text->data[i];

            } else {
                bracket = 0;
                var.data = &text->data[i];
            }

            for ( /* void */ ; i < text->len; i++, var.len++) {
                ch = text->data[i];

                if (ch == '}' && bracket) {
                    i++;
                    bracket = 0;
                    break;
                }

                if ((ch >= 'A' && ch <= 'Z')
                    || (ch >= 'a' && ch <= 'z')
                    || (ch >= '0' && ch <= '9')
                    || ch == '_')
                {
                    continue;
                }

                break;
            }

            if (bracket) {
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "the closing bracket in \"%V\" "
                              "variable is missing", &var);
                return NGX_HTTP_SSI_ERROR;
            }

            if (var.len == 0) {
                goto invalid_variable;
            }

            key = ngx_hash_strlow(var.data, var.data, var.len);

            val = ngx_http_ssi_get_variable(r, &var, key);

            if (val == NULL) {
                vv = ngx_http_get_variable(r, &var, key);
                if (vv == NULL) {
                    return NGX_ERROR;
                }

                if (vv->not_found) {
                    continue;
                }

                part_data = vv->data;
                part_len = vv->len;

            } else {
                part_data = val->data;
                part_len = val->len;
            }

        } else {
            part_data = &text->data[i];
            quoted = 0;

            for (p = part_data; i < text->len; i++) {
                ch = text->data[i];

                if (!quoted) {

                    if (ch == '\\') {
                        quoted = 1;
                        continue;
                    }

                    if (ch == '$') {
                        break;
                    }

                } else {
                    quoted = 0;

                    if (ch != '\\' && ch != '\'' && ch != '"' && ch != '$') {
                        *p++ = '\\';
                    }
                }

                *p++ = ch;
            }

            part_len = p - part_data;
        }

        len += part_len;

        size = ngx_array_push(&lengths);
        if (size == NULL) {
            return NGX_ERROR;
        }

        *size = part_len;

        value = ngx_array_push(&values);
        if (value == NULL) {
            return NGX_ERROR;
        }

        *value = part_data;
    }

    prefix = 0;

    size = lengths.elts;
    value = values.elts;

    if (flags & NGX_HTTP_SSI_ADD_PREFIX) {
        for (i = 0; i < values.nelts; i++) {
            if (size[i] != 0) {
                if (*value[i] != '/') {
                    for (prefix = r->uri.len; prefix; prefix--) {
                        if (r->uri.data[prefix - 1] == '/') {
                            len += prefix;
                            break;
                        }
                    }
                }

                break;
            }
        }
    }

    p = ngx_pnalloc(r->pool, len + ((flags & NGX_HTTP_SSI_ADD_ZERO) ? 1 : 0));
    if (p == NULL) {
        return NGX_ERROR;
    }

    text->len = len;
    text->data = p;

    p = ngx_copy(p, r->uri.data, prefix);

    for (i = 0; i < values.nelts; i++) {
        p = ngx_copy(p, value[i], size[i]);
    }

    return NGX_OK;

invalid_variable:

    ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                  "invalid variable name in \"%V\"", text);

    return NGX_HTTP_SSI_ERROR;
}